

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O3

void __thiscall
rr::FragmentProcessor::render
          (FragmentProcessor *this,MultisamplePixelBufferAccess *msColorBuffer,
          MultisamplePixelBufferAccess *msDepthBuffer,MultisamplePixelBufferAccess *msStencilBuffer,
          Fragment *inputFragments,int numFragments,FaceType fragmentFacing,
          FragmentOperationState *state)

{
  float fVar1;
  bool bVar2;
  int numSamplesPerFragment;
  undefined4 uVar3;
  bool bVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  StencilState *stencilState;
  ConstPixelBufferAccess *stencilBuffer;
  BlendState *blendAState;
  BlendState *blendRGBState;
  Vec4 *blendColor;
  bool isSRGB;
  byte bVar12;
  int iVar13;
  long lVar14;
  Vec3 *pVVar15;
  ulong uVar16;
  byte bVar17;
  float *pfVar18;
  SampleData *pSVar19;
  SampleData *pSVar20;
  long lVar21;
  SampleData *pSVar22;
  int regSampleNdx_3;
  Fragment *pFVar23;
  bool bVar24;
  int fragNdxOffset;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  undefined1 uVar36;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 uVar38;
  float afVar39 [4];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  float fVar48;
  Vector<float,_3> vec;
  Vec4 dstColor;
  TextureFormat local_148;
  float fStack_140;
  float fStack_13c;
  Fragment *local_138;
  TextureChannelClass local_12c;
  undefined1 local_128 [16];
  float afStack_118 [2];
  undefined8 local_110;
  float local_108;
  BVec4 *local_100;
  SampleData *local_f8;
  undefined1 local_f0 [24];
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  ulong local_c8;
  uint local_bc;
  ConstPixelBufferAccess *local_b8;
  StencilState *local_b0;
  ConstPixelBufferAccess *local_a8;
  float *local_a0;
  BlendState *local_98;
  BlendState *local_90;
  Vec4 *local_88;
  Vec3 *local_80;
  WindowRectangle *local_78;
  ulong local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Vec4 local_58;
  Vec4 local_48;
  undefined1 auVar30 [16];
  undefined2 uVar37;
  
  bVar4 = false;
  if ((0 < (msDepthBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[0]) &&
     (0 < (msDepthBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[1])) {
    bVar4 = 0 < (msDepthBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[2];
  }
  bVar24 = false;
  if ((0 < (msStencilBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[0]) &&
     (0 < (msStencilBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[1])) {
    bVar24 = 0 < (msStencilBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[2];
  }
  bVar2 = state->stencilTestEnabled;
  local_128[0] = state->depthTestEnabled;
  local_138 = inputFragments;
  local_f8 = this->m_sampleRegister;
  local_b8 = (ConstPixelBufferAccess *)msDepthBuffer;
  local_a8 = (ConstPixelBufferAccess *)msStencilBuffer;
  local_12c = tcu::getTextureChannelClass
                        ((msColorBuffer->m_access).super_ConstPixelBufferAccess.m_format.type);
  local_bc = (uint)(local_12c == TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
  if (local_12c == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    local_bc = 2;
  }
  numSamplesPerFragment = (msColorBuffer->m_access).super_ConstPixelBufferAccess.m_size.m_data[0];
  uVar25 = numSamplesPerFragment * numFragments - 1;
  uVar26 = numSamplesPerFragment * numFragments + 0x3e;
  if (-1 < (int)uVar25) {
    uVar26 = uVar25;
  }
  local_c8 = (ulong)uVar26;
  uVar3 = *(undefined4 *)(state->colorMask).m_data;
  uVar36 = (undefined1)((uint)uVar3 >> 0x18);
  uVar37 = CONCAT11(uVar36,uVar36);
  uVar36 = (undefined1)((uint)uVar3 >> 0x10);
  uVar38 = CONCAT35(CONCAT21(uVar37,uVar36),CONCAT14(uVar36,uVar3));
  uVar36 = (undefined1)((uint)uVar3 >> 8);
  uVar8 = CONCAT53(CONCAT41((int)((ulong)uVar38 >> 0x20),uVar36),CONCAT12(uVar36,(short)uVar3));
  uVar16 = CONCAT62((int6)((ulong)uVar8 >> 0x10),(short)uVar3) & 0xffffffffffff00ff;
  auVar32._8_4_ = 0;
  auVar32._0_8_ = uVar16;
  auVar32._12_2_ = uVar37;
  auVar32._14_2_ = uVar37;
  uVar37 = (undefined2)((ulong)uVar38 >> 0x20);
  auVar42._12_4_ = auVar32._12_4_;
  auVar42._8_2_ = 0;
  auVar42._0_8_ = uVar16;
  auVar42._10_2_ = uVar37;
  auVar30._10_6_ = auVar42._10_6_;
  auVar30._8_2_ = uVar37;
  auVar30._0_8_ = uVar16;
  uVar37 = (undefined2)((ulong)uVar8 >> 0x10);
  auVar29._8_8_ = auVar30._8_8_;
  auVar29._6_2_ = uVar37;
  auVar29._0_4_ = (int)uVar16;
  auVar29._4_2_ = uVar37;
  auVar31._0_4_ = (auVar29._0_4_ << 0x1f) >> 0x1f;
  auVar31._4_4_ = (auVar29._4_4_ << 0x1f) >> 0x1f;
  auVar31._8_4_ = (auVar30._8_4_ << 0x1f) >> 0x1f;
  auVar31._12_4_ = (auVar42._12_4_ << 0x1f) >> 0x1f;
  afVar39 = (float  [4])(auVar31 & _DAT_002277f0);
  local_48.m_data[0] = afVar39[0];
  local_48.m_data[1] = afVar39[1];
  local_48.m_data[2] = afVar39[2];
  local_48.m_data[3] = afVar39[3];
  afVar39 = (float  [4])(~auVar31 & _DAT_002277f0);
  local_58.m_data[0] = afVar39[0];
  local_58.m_data[1] = afVar39[1];
  local_58.m_data[2] = afVar39[2];
  local_58.m_data[3] = afVar39[3];
  if (state->sRGBEnabled == true) {
    isSRGB = tcu::isSRGB((msColorBuffer->m_access).super_ConstPixelBufferAccess.m_format);
  }
  else {
    isSRGB = false;
  }
  if (-0x40 < (int)uVar25) {
    bVar12 = bVar4 & local_128[0];
    bVar17 = bVar24 & bVar2;
    local_c8 = (ulong)(uint)((int)local_c8 >> 6);
    local_b0 = state->stencilStates + fragmentFacing;
    local_100 = &state->colorMask;
    local_78 = &state->scissorRectangle;
    local_88 = &state->blendColor;
    local_90 = &state->blendRGBState;
    local_98 = &state->blendAState;
    local_a0 = (local_f8->clampedBlendDstColor).m_data + 3;
    local_80 = &local_f8->blendedRGB;
    uVar16 = 0;
    pSVar22 = local_f8;
    pFVar23 = local_138;
    do {
      local_70 = uVar16;
      fragNdxOffset = ((int)uVar16 << 6) / numSamplesPerFragment;
      uVar16 = 0;
      pSVar19 = pSVar22;
      do {
        uVar5 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff;
        iVar13 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
        if (iVar13 < numFragments) {
          ((SampleData *)&pSVar19->isAlive)->isAlive =
               (pFVar23[iVar13].coverage >>
                ((uint)((long)uVar5 % (long)numSamplesPerFragment) & 0x1f) & 1) != 0;
          pSVar19->depthPassed = true;
        }
        else {
          ((SampleData *)&pSVar19->isAlive)->isAlive = false;
        }
        uVar16 = uVar16 + 1;
        pSVar19 = pSVar19 + 1;
      } while (uVar16 != 0x40);
      if (state->scissorTestEnabled != false) {
        executeScissorTest((FragmentProcessor *)pSVar22,fragNdxOffset,numSamplesPerFragment,pFVar23,
                           local_78);
      }
      stencilBuffer = local_a8;
      stencilState = local_b0;
      pSVar19 = pSVar22;
      if (bVar17 != 0) {
        executeStencilCompare
                  ((FragmentProcessor *)pSVar22,fragNdxOffset,numSamplesPerFragment,pFVar23,local_b0
                   ,state->numStencilBits,local_a8);
        pSVar19 = local_f8;
        executeStencilSFail((FragmentProcessor *)local_f8,fragNdxOffset,numSamplesPerFragment,
                            pFVar23,stencilState,state->numStencilBits,
                            (PixelBufferAccess *)stencilBuffer);
      }
      if ((bVar12 != 0) &&
         (executeDepthCompare((FragmentProcessor *)pSVar19,fragNdxOffset,numSamplesPerFragment,
                              pFVar23,state->depthFunc,local_b8), state->depthMask == true)) {
        executeDepthWrite((FragmentProcessor *)pSVar19,fragNdxOffset,numSamplesPerFragment,pFVar23,
                          (PixelBufferAccess *)local_b8);
      }
      if (bVar17 != 0) {
        executeStencilDpFailAndPass
                  ((FragmentProcessor *)pSVar19,fragNdxOffset,numSamplesPerFragment,pFVar23,local_b0
                   ,state->numStencilBits,(PixelBufferAccess *)local_a8);
      }
      if (bVar12 != 0) {
        lVar14 = 0;
        do {
          if (*(char *)((long)(pSVar19->clampedBlendSrcColor).m_data + lVar14 + -4) == '\x01') {
            uVar36 = *(undefined1 *)((long)(pSVar19->clampedBlendSrcColor).m_data + lVar14 + -2);
          }
          else {
            uVar36 = 0;
          }
          *(undefined1 *)((long)(pSVar19->clampedBlendSrcColor).m_data + lVar14 + -4) = uVar36;
          lVar14 = lVar14 + 0x84;
        } while (lVar14 != 0x2100);
      }
      pSVar22 = pSVar19;
      if (local_bc == 0) {
        if (local_12c == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
          _local_d8 = (undefined1  [16])0x0;
          local_128 = _DAT_002277f0;
        }
        else {
          if (local_12c == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
            local_128._8_8_ = 0x3f8000003f800000;
            local_128._0_8_ = 0x3f8000003f800000;
            _local_d8 = _DAT_00234d20;
          }
          else {
            local_128._8_8_ = 0x7f8000007f800000;
            local_128._0_8_ = 0x7f8000007f800000;
            _local_d8 = _DAT_00234d30;
          }
        }
        if (state->blendMode == BLENDMODE_STANDARD) {
          uVar16 = 0;
          do {
            pFVar23 = local_138;
            if (pSVar19->isAlive == true) {
              uVar5 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff;
              iVar13 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_f0,(int)msColorBuffer,
                         (int)((long)uVar5 % (long)numSamplesPerFragment),
                         local_138[iVar13].pixelCoord.m_data[0]);
              auVar32 = *(undefined1 (*) [16])pFVar23[iVar13].value.v.uData;
              auVar42 = minps(local_128,auVar32);
              uVar25 = -(uint)(auVar32._0_4_ < (float)local_d8._0_4_);
              uVar26 = -(uint)(auVar32._4_4_ < (float)local_d8._4_4_);
              uVar27 = -(uint)(auVar32._8_4_ < fStack_d0);
              uVar28 = -(uint)(auVar32._12_4_ < fStack_cc);
              (pSVar19->clampedBlendSrcColor).m_data[0] =
                   (float)(~uVar25 & auVar42._0_4_ | local_d8._0_4_ & uVar25);
              (pSVar19->clampedBlendSrcColor).m_data[1] =
                   (float)(~uVar26 & auVar42._4_4_ | local_d8._4_4_ & uVar26);
              (pSVar19->clampedBlendSrcColor).m_data[2] =
                   (float)(~uVar27 & auVar42._8_4_ | (uint)fStack_d0 & uVar27);
              (pSVar19->clampedBlendSrcColor).m_data[3] =
                   (float)(~uVar28 & auVar42._12_4_ | (uint)fStack_cc & uVar28);
              auVar32 = *(undefined1 (*) [16])pFVar23[iVar13].value1.v.uData;
              auVar42 = minps(local_128,auVar32);
              uVar25 = -(uint)(auVar32._0_4_ < (float)local_d8._0_4_);
              uVar26 = -(uint)(auVar32._4_4_ < (float)local_d8._4_4_);
              uVar27 = -(uint)(auVar32._8_4_ < fStack_d0);
              uVar28 = -(uint)(auVar32._12_4_ < fStack_cc);
              (pSVar19->clampedBlendSrc1Color).m_data[0] =
                   (float)(~uVar25 & auVar42._0_4_ | local_d8._0_4_ & uVar25);
              (pSVar19->clampedBlendSrc1Color).m_data[1] =
                   (float)(~uVar26 & auVar42._4_4_ | local_d8._4_4_ & uVar26);
              (pSVar19->clampedBlendSrc1Color).m_data[2] =
                   (float)(~uVar27 & auVar42._8_4_ | (uint)fStack_d0 & uVar27);
              (pSVar19->clampedBlendSrc1Color).m_data[3] =
                   (float)(~uVar28 & auVar42._12_4_ | (uint)fStack_cc & uVar28);
              if (isSRGB == false) {
                local_148.order = local_f0._0_4_;
                local_148.type = local_f0._4_4_;
                fStack_140 = (float)local_f0._8_8_;
                fStack_13c = SUB84(local_f0._8_8_,4);
              }
              else {
                tcu::sRGBToLinear((tcu *)&local_148,(Vec4 *)local_f0);
              }
              auVar10._8_4_ = fStack_140;
              auVar10._0_4_ = local_148.order;
              auVar10._4_4_ = local_148.type;
              auVar10._12_4_ = fStack_13c;
              auVar32 = minps(local_128,auVar10);
              uVar25 = -(uint)((float)local_148.order < (float)local_d8._0_4_);
              uVar26 = -(uint)((float)local_148.type < (float)local_d8._4_4_);
              auVar45._0_4_ = local_d8._0_4_ & uVar25;
              auVar45._4_4_ = local_d8._4_4_ & uVar26;
              auVar45._8_4_ = (uint)fStack_d0 & -(uint)(fStack_140 < fStack_d0);
              auVar45._12_4_ = (uint)fStack_cc & -(uint)(fStack_13c < fStack_cc);
              auVar35._0_4_ = ~uVar25 & auVar32._0_4_;
              auVar35._4_4_ = ~uVar26 & auVar32._4_4_;
              auVar35._8_4_ = ~-(uint)(fStack_140 < fStack_d0) & auVar32._8_4_;
              auVar35._12_4_ = ~-(uint)(fStack_13c < fStack_cc) & auVar32._12_4_;
              *(undefined1 (*) [16])(pSVar19->clampedBlendDstColor).m_data = auVar35 | auVar45;
              pSVar22 = local_f8;
            }
            blendColor = local_88;
            blendRGBState = local_90;
            uVar16 = uVar16 + 1;
            pSVar19 = pSVar19 + 1;
          } while (uVar16 != 0x40);
          executeBlendFactorComputeRGB((FragmentProcessor *)pSVar22,local_88,local_90);
          blendAState = local_98;
          executeBlendFactorComputeA((FragmentProcessor *)pSVar22,blendColor,local_98);
          executeBlend((FragmentProcessor *)pSVar22,blendRGBState,blendAState);
          pFVar23 = local_138;
        }
        else if (state->blendMode == BLENDMODE_ADVANCED) {
          uVar16 = 0;
          pfVar18 = local_a0;
          do {
            if (*(char *)(pfVar18 + -0xc) == '\x01') {
              uVar5 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff;
              iVar13 = (int)((long)uVar5 / (long)numSamplesPerFragment) + fragNdxOffset;
              local_68 = *(undefined8 *)&local_138[iVar13].value.v;
              uStack_60 = *(undefined8 *)((long)&local_138[iVar13].value.v + 8);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_f0,(int)msColorBuffer,
                         (int)((long)uVar5 % (long)numSamplesPerFragment),
                         local_138[iVar13].pixelCoord.m_data[0]);
              auVar11._8_8_ = uStack_60;
              auVar11._0_8_ = local_68;
              auVar32 = minps(local_128,auVar11);
              uVar25 = -(uint)((float)local_68 < (float)local_d8._0_4_);
              uVar26 = -(uint)((float)((ulong)local_68 >> 0x20) < (float)local_d8._4_4_);
              uVar27 = -(uint)((float)uStack_60 < fStack_d0);
              uVar28 = -(uint)((float)((ulong)uStack_60 >> 0x20) < fStack_cc);
              auVar40._0_4_ = local_d8._0_4_ & uVar25;
              auVar40._4_4_ = local_d8._4_4_ & uVar26;
              auVar40._8_4_ = (uint)fStack_d0 & uVar27;
              auVar40._12_4_ = (uint)fStack_cc & uVar28;
              auVar43._0_4_ = ~uVar25 & auVar32._0_4_;
              auVar43._4_4_ = ~uVar26 & auVar32._4_4_;
              auVar43._8_4_ = ~uVar27 & auVar32._8_4_;
              auVar43._12_4_ = ~uVar28 & auVar32._12_4_;
              auVar43 = auVar43 | auVar40;
              fVar46 = auVar43._12_4_;
              auVar33._4_4_ = fVar46;
              auVar33._0_4_ = fVar46;
              auVar33._8_4_ = fVar46;
              auVar33._12_4_ = fVar46;
              if (0.0 < fVar46) {
                auVar32 = divps(auVar43,auVar33);
                uVar38 = auVar32._0_8_;
              }
              else {
                uVar38 = 0;
              }
              if (fVar46 <= 0.0) {
                auVar6._12_4_ = 0;
                auVar6._0_12_ = auVar33._4_12_;
                auVar33 = auVar6 << 0x20;
              }
              *(undefined8 *)(pfVar18 + -0xb) = uVar38;
              pfVar18[-9] = (float)(-(uint)(0.0 < fVar46) & (uint)(auVar43._8_4_ / fVar46));
              pfVar18[-8] = (float)auVar33._0_4_;
              if (isSRGB == false) {
                local_148.order = local_f0._0_4_;
                local_148.type = local_f0._4_4_;
                fStack_140 = (float)local_f0._8_8_;
                fStack_13c = SUB84(local_f0._8_8_,4);
              }
              else {
                tcu::sRGBToLinear((tcu *)&local_148,(Vec4 *)local_f0);
              }
              auVar9._8_4_ = fStack_140;
              auVar9._0_4_ = local_148.order;
              auVar9._4_4_ = local_148.type;
              auVar9._12_4_ = fStack_13c;
              auVar32 = minps(local_128,auVar9);
              uVar25 = -(uint)((float)local_148.order < (float)local_d8._0_4_);
              uVar26 = -(uint)((float)local_148.type < (float)local_d8._4_4_);
              auVar44._0_4_ = local_d8._0_4_ & uVar25;
              auVar44._4_4_ = local_d8._4_4_ & uVar26;
              auVar44._8_4_ = (uint)fStack_d0 & -(uint)(fStack_140 < fStack_d0);
              auVar44._12_4_ = (uint)fStack_cc & -(uint)(fStack_13c < fStack_cc);
              auVar41._0_4_ = ~uVar25 & auVar32._0_4_;
              auVar41._4_4_ = ~uVar26 & auVar32._4_4_;
              auVar41._8_4_ = ~-(uint)(fStack_140 < fStack_d0) & auVar32._8_4_;
              auVar41._12_4_ = ~-(uint)(fStack_13c < fStack_cc) & auVar32._12_4_;
              auVar41 = auVar41 | auVar44;
              fVar46 = auVar41._12_4_;
              auVar34._4_4_ = fVar46;
              auVar34._0_4_ = fVar46;
              auVar34._8_4_ = fVar46;
              auVar34._12_4_ = fVar46;
              if (0.0 < fVar46) {
                auVar32 = divps(auVar41,auVar34);
                uVar38 = auVar32._0_8_;
              }
              else {
                uVar38 = 0;
              }
              if (fVar46 <= 0.0) {
                auVar7._12_4_ = 0;
                auVar7._0_12_ = auVar34._4_12_;
                auVar34 = auVar7 << 0x20;
              }
              *(undefined8 *)((Vec4 *)(pfVar18 + -3))->m_data = uVar38;
              pfVar18[-1] = (float)(-(uint)(0.0 < fVar46) & (uint)(auVar41._8_4_ / fVar46));
              *pfVar18 = auVar34._0_4_;
            }
            uVar16 = uVar16 + 1;
            pfVar18 = pfVar18 + 0x21;
          } while (uVar16 != 0x40);
          executeAdvancedBlend((FragmentProcessor *)pSVar19,state->blendEquationAdvaced);
          pFVar23 = local_138;
        }
        else {
          uVar16 = 0;
          do {
            if (pSVar19[uVar16].isAlive == true) {
              iVar13 = (int)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff
                                   ) / (long)numSamplesPerFragment) + fragNdxOffset;
              uVar38 = *(undefined8 *)((long)&pFVar23[iVar13].value.v + 8);
              local_148 = *(TextureFormat *)&pFVar23[iVar13].value.v;
              fStack_140 = (float)uVar38;
              fStack_13c = (float)((ulong)uVar38 >> 0x20);
              local_f0._0_8_ = &local_148;
              local_f0._8_8_ = 0x100000000;
              local_f0._16_4_ = 2;
              local_110 = 0;
              local_108 = 0.0;
              lVar14 = 2;
              do {
                afStack_118[lVar14] = (float)(&local_148.order)[*(int *)(local_f0 + lVar14 * 4)];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 5);
              pSVar19[uVar16].blendedRGB.m_data[2] = local_108;
              *(undefined8 *)pSVar19[uVar16].blendedRGB.m_data = local_110;
              pSVar19[uVar16].blendedA = (float)pFVar23[iVar13].value.v.uData[3];
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != 0x40);
        }
        auVar32 = _local_d8;
        if (local_12c != TEXTURECHANNELCLASS_FLOATING_POINT) {
          fVar46 = local_d8._8_4_;
          fVar47 = local_d8._12_4_;
          lVar14 = 0;
          pVVar15 = local_80;
          do {
            if (pSVar22[lVar14].isAlive == true) {
              local_d8 = auVar32._0_8_;
              local_148.order = local_d8._0_4_;
              local_148.type = local_d8._4_4_;
              fStack_140 = fVar46;
              local_110 = local_128._0_8_;
              local_108 = local_128._8_4_;
              local_f0._0_4_ = R;
              local_f0._4_4_ = SNORM_INT8;
              local_f0._8_8_ = local_f0._8_8_ & 0xffffffff00000000;
              lVar21 = 0;
              do {
                fVar1 = pVVar15->m_data[lVar21];
                fVar48 = *(float *)((long)&local_110 + lVar21 * 4);
                if (fVar1 <= fVar48) {
                  fVar48 = fVar1;
                }
                uVar25 = -(uint)(fVar1 < (float)(&local_148.order)[lVar21]);
                *(ChannelOrder *)(local_f0 + lVar21 * 4) =
                     uVar25 & (&local_148.order)[lVar21] | ~uVar25 & (uint)fVar48;
                lVar21 = lVar21 + 1;
              } while (lVar21 != 3);
              pSVar22[lVar14].blendedRGB.m_data[2] = (float)local_f0._8_4_;
              *(undefined8 *)pSVar22[lVar14].blendedRGB.m_data = local_f0._0_8_;
              fVar1 = pSVar22[lVar14].blendedA;
              fVar48 = local_128._12_4_;
              if (fVar1 <= local_128._12_4_) {
                fVar48 = fVar1;
              }
              uVar25 = -(uint)(fVar1 < fVar47);
              pSVar22[lVar14].blendedA = (float)(uVar25 & (uint)fVar47 | ~uVar25 & (uint)fVar48);
            }
            lVar14 = lVar14 + 1;
            pVVar15 = pVVar15 + 0xb;
          } while (lVar14 != 0x40);
        }
        bVar4 = (state->colorMask).m_data[1];
        _local_d8 = auVar32;
        if ((state->colorMask).m_data[0] == true) {
          if (((bVar4 == false) || ((state->colorMask).m_data[2] != true)) ||
             ((state->colorMask).m_data[3] != true)) {
LAB_001c62dc:
            executeMaskedColorWrite
                      ((FragmentProcessor *)pSVar22,fragNdxOffset,numSamplesPerFragment,pFVar23,
                       &local_48,&local_58,isSRGB,&msColorBuffer->m_access);
          }
          else if (((msColorBuffer->m_access).super_ConstPixelBufferAccess.m_format.order == RGBA)
                  && ((msColorBuffer->m_access).super_ConstPixelBufferAccess.m_format.type ==
                      UNORM_INT8)) {
            executeRGBA8ColorWrite
                      ((FragmentProcessor *)pSVar22,fragNdxOffset,numSamplesPerFragment,pFVar23,
                       &msColorBuffer->m_access);
          }
          else {
            executeColorWrite((FragmentProcessor *)pSVar22,fragNdxOffset,numSamplesPerFragment,
                              pFVar23,isSRGB,&msColorBuffer->m_access);
          }
        }
        else if (((bVar4 != false) || ((state->colorMask).m_data[2] != false)) ||
                ((state->colorMask).m_data[3] == true)) goto LAB_001c62dc;
      }
      else {
        uVar16 = 0;
        pSVar20 = pSVar19;
        if (local_bc == 2) {
          do {
            if (pSVar20->isAlive == true) {
              *(anon_union_16_3_1194ccdc_for_v *)(pSVar20->signedValue).m_data =
                   pFVar23[(int)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 |
                                       uVar16 & 0xffffffff) / (long)numSamplesPerFragment) +
                           fragNdxOffset].value.v;
            }
            uVar16 = uVar16 + 1;
            pSVar20 = pSVar20 + 1;
          } while (uVar16 != 0x40);
          if (((local_100->m_data[0] != false) || ((state->colorMask).m_data[1] != false)) ||
             (((state->colorMask).m_data[2] != false || ((state->colorMask).m_data[3] == true)))) {
            executeSignedValueWrite
                      ((FragmentProcessor *)pSVar19,fragNdxOffset,numSamplesPerFragment,pFVar23,
                       local_100,&msColorBuffer->m_access);
          }
        }
        else {
          do {
            if (pSVar20->isAlive == true) {
              *(anon_union_16_3_1194ccdc_for_v *)(pSVar20->unsignedValue).m_data =
                   pFVar23[(int)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 |
                                       uVar16 & 0xffffffff) / (long)numSamplesPerFragment) +
                           fragNdxOffset].value.v;
            }
            uVar16 = uVar16 + 1;
            pSVar20 = pSVar20 + 1;
          } while (uVar16 != 0x40);
          if ((((local_100->m_data[0] != false) || ((state->colorMask).m_data[1] != false)) ||
              ((state->colorMask).m_data[2] != false)) || ((state->colorMask).m_data[3] == true)) {
            executeUnsignedValueWrite
                      ((FragmentProcessor *)pSVar19,fragNdxOffset,numSamplesPerFragment,pFVar23,
                       local_100,&msColorBuffer->m_access);
          }
        }
      }
      uVar16 = (ulong)((int)local_70 + 1);
    } while ((int)local_70 != (int)local_c8);
  }
  return;
}

Assistant:

void FragmentProcessor::render (const rr::MultisamplePixelBufferAccess&		msColorBuffer,
								const rr::MultisamplePixelBufferAccess&		msDepthBuffer,
								const rr::MultisamplePixelBufferAccess&		msStencilBuffer,
								const Fragment*								inputFragments,
								int											numFragments,
								FaceType									fragmentFacing,
								const FragmentOperationState&				state)
{
	DE_ASSERT(fragmentFacing < FACETYPE_LAST);
	DE_ASSERT(state.numStencilBits < 32); // code bitshifts numStencilBits, avoid undefined behavior

	const tcu::PixelBufferAccess&	colorBuffer			= msColorBuffer.raw();
	const tcu::PixelBufferAccess&	depthBuffer			= msDepthBuffer.raw();
	const tcu::PixelBufferAccess&	stencilBuffer		= msStencilBuffer.raw();

	bool							hasDepth			= depthBuffer.getWidth() > 0	&& depthBuffer.getHeight() > 0		&& depthBuffer.getDepth() > 0;
	bool							hasStencil			= stencilBuffer.getWidth() > 0	&& stencilBuffer.getHeight() > 0	&& stencilBuffer.getDepth() > 0;
	bool							doDepthTest			= hasDepth && state.depthTestEnabled;
	bool							doStencilTest		= hasStencil && state.stencilTestEnabled;

	tcu::TextureChannelClass		colorbufferClass	= tcu::getTextureChannelClass(msColorBuffer.raw().getFormat().type);
	rr::GenericVecType				fragmentDataType	= (colorbufferClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER) ? (rr::GENERICVECTYPE_INT32) : ((colorbufferClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER) ? (rr::GENERICVECTYPE_UINT32) : (rr::GENERICVECTYPE_FLOAT));

	DE_ASSERT((!hasDepth || colorBuffer.getWidth() == depthBuffer.getWidth())	&& (!hasStencil || colorBuffer.getWidth() == stencilBuffer.getWidth()));
	DE_ASSERT((!hasDepth || colorBuffer.getHeight() == depthBuffer.getHeight())	&& (!hasStencil || colorBuffer.getHeight() == stencilBuffer.getHeight()));
	DE_ASSERT((!hasDepth || colorBuffer.getDepth() == depthBuffer.getDepth())	&& (!hasStencil || colorBuffer.getDepth() == stencilBuffer.getDepth()));

	// Combined formats must be separated beforehand
	DE_ASSERT(!hasDepth || (!tcu::isCombinedDepthStencilType(depthBuffer.getFormat().type) && depthBuffer.getFormat().order == tcu::TextureFormat::D));
	DE_ASSERT(!hasStencil || (!tcu::isCombinedDepthStencilType(stencilBuffer.getFormat().type) && stencilBuffer.getFormat().order == tcu::TextureFormat::S));

	int						numSamplesPerFragment		= colorBuffer.getWidth();
	int						totalNumSamples				= numFragments*numSamplesPerFragment;
	int						numSampleGroups				= (totalNumSamples - 1) / SAMPLE_REGISTER_SIZE + 1; // \note totalNumSamples/SAMPLE_REGISTER_SIZE rounded up.
	const StencilState&		stencilState				= state.stencilStates[fragmentFacing];
	Vec4					colorMaskFactor				(state.colorMask[0] ? 1.0f : 0.0f, state.colorMask[1] ? 1.0f : 0.0f, state.colorMask[2] ? 1.0f : 0.0f, state.colorMask[3] ? 1.0f : 0.0f);
	Vec4					colorMaskNegationFactor		(state.colorMask[0] ? 0.0f : 1.0f, state.colorMask[1] ? 0.0f : 1.0f, state.colorMask[2] ? 0.0f : 1.0f, state.colorMask[3] ? 0.0f : 1.0f);
	bool					sRGBTarget					= state.sRGBEnabled && tcu::isSRGB(colorBuffer.getFormat());

	DE_ASSERT(SAMPLE_REGISTER_SIZE % numSamplesPerFragment == 0);

	// Divide the fragments' samples into groups of size SAMPLE_REGISTER_SIZE, and perform
	// the per-sample operations for one group at a time.

	for (int sampleGroupNdx = 0; sampleGroupNdx < numSampleGroups; sampleGroupNdx++)
	{
		// The index of the fragment of the sample at the beginning of m_sampleRegisters.
		int groupFirstFragNdx = (sampleGroupNdx*SAMPLE_REGISTER_SIZE) / numSamplesPerFragment;

		// Initialize sample data in the sample register.

		for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
		{
			int fragNdx			= groupFirstFragNdx + regSampleNdx/numSamplesPerFragment;
			int fragSampleNdx	= regSampleNdx % numSamplesPerFragment;

			if (fragNdx < numFragments)
			{
				m_sampleRegister[regSampleNdx].isAlive		= (inputFragments[fragNdx].coverage & (1u << fragSampleNdx)) != 0;
				m_sampleRegister[regSampleNdx].depthPassed	= true; // \note This will stay true if depth test is disabled.
			}
			else
				m_sampleRegister[regSampleNdx].isAlive = false;
		}

		// Scissor test.

		if (state.scissorTestEnabled)
			executeScissorTest(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.scissorRectangle);

		// Stencil test.

		if (doStencilTest)
		{
			executeStencilCompare(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);
			executeStencilSFail(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);
		}

		// Depth test.
		// \note Current value of isAlive is needed for dpPass and dpFail, so it's only updated after them and not right after depth test.

		if (doDepthTest)
		{
			executeDepthCompare(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.depthFunc, depthBuffer);

			if (state.depthMask)
				executeDepthWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, depthBuffer);
		}

		// Do dpFail and dpPass stencil writes.

		if (doStencilTest)
			executeStencilDpFailAndPass(groupFirstFragNdx, numSamplesPerFragment, inputFragments, stencilState, state.numStencilBits, stencilBuffer);

		// Kill the samples that failed depth test.

		if (doDepthTest)
		{
			for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				m_sampleRegister[regSampleNdx].isAlive = m_sampleRegister[regSampleNdx].isAlive && m_sampleRegister[regSampleNdx].depthPassed;
		}

		// Paint fragments to target

		switch (fragmentDataType)
		{
			case rr::GENERICVECTYPE_FLOAT:
			{
				// Select min/max clamping values for blending factors and operands
				Vec4 minClampValue;
				Vec4 maxClampValue;

				if (colorbufferClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
				{
					minClampValue = Vec4(0.0f);
					maxClampValue = Vec4(1.0f);
				}
				else if (colorbufferClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)
				{
					minClampValue = Vec4(-1.0f);
					maxClampValue = Vec4(1.0f);
				}
				else
				{
					// No clamping
					minClampValue = Vec4(-std::numeric_limits<float>::infinity());
					maxClampValue = Vec4(std::numeric_limits<float>::infinity());
				}

				// Blend calculation - only if using blend.
				if (state.blendMode == BLENDMODE_STANDARD)
				{
					// Put dst color to register, doing srgb-to-linear conversion if needed.
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
							const Fragment&		frag			= inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];
							Vec4				dstColor		= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

							m_sampleRegister[regSampleNdx].clampedBlendSrcColor		= clamp(frag.value.get<float>(), minClampValue, maxClampValue);
							m_sampleRegister[regSampleNdx].clampedBlendSrc1Color	= clamp(frag.value1.get<float>(), minClampValue, maxClampValue);
							m_sampleRegister[regSampleNdx].clampedBlendDstColor		= clamp(sRGBTarget ? tcu::sRGBToLinear(dstColor) : dstColor, minClampValue, maxClampValue);
						}
					}

					// Calculate blend factors to register.
					executeBlendFactorComputeRGB(state.blendColor, state.blendRGBState);
					executeBlendFactorComputeA(state.blendColor, state.blendAState);

					// Compute blended color.
					executeBlend(state.blendRGBState, state.blendAState);
				}
				else if (state.blendMode == BLENDMODE_ADVANCED)
				{
					// Unpremultiply colors for blending, and do sRGB->linear if necessary
					// \todo [2014-03-17 pyry] Re-consider clampedBlend*Color var names
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
							const Fragment&		frag			= inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];
							const Vec4			srcColor		= frag.value.get<float>();
							const Vec4			dstColor		= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

							m_sampleRegister[regSampleNdx].clampedBlendSrcColor		= unpremultiply(clamp(srcColor, minClampValue, maxClampValue));
							m_sampleRegister[regSampleNdx].clampedBlendDstColor		= unpremultiply(clamp(sRGBTarget ? tcu::sRGBToLinear(dstColor) : dstColor, minClampValue, maxClampValue));
						}
					}

					executeAdvancedBlend(state.blendEquationAdvaced);
				}
				else
				{
					// Not using blend - just put values to register as-is.
					DE_ASSERT(state.blendMode == BLENDMODE_NONE);

					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

							m_sampleRegister[regSampleNdx].blendedRGB	= frag.value.get<float>().xyz();
							m_sampleRegister[regSampleNdx].blendedA		= frag.value.get<float>().w();
						}
					}
				}

				// Clamp result values in sample register
				if (colorbufferClass != tcu::TEXTURECHANNELCLASS_FLOATING_POINT)
				{
					for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
					{
						if (m_sampleRegister[regSampleNdx].isAlive)
						{
							m_sampleRegister[regSampleNdx].blendedRGB	= clamp(m_sampleRegister[regSampleNdx].blendedRGB, minClampValue.swizzle(0, 1, 2), maxClampValue.swizzle(0, 1, 2));
							m_sampleRegister[regSampleNdx].blendedA		= clamp(m_sampleRegister[regSampleNdx].blendedA, minClampValue.w(), maxClampValue.w());
						}
					}
				}

				// Finally, write the colors to the color buffer.

				if (state.colorMask[0] && state.colorMask[1] && state.colorMask[2] && state.colorMask[3])
				{
					if (colorBuffer.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8))
						executeRGBA8ColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, colorBuffer);
					else
						executeColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, sRGBTarget, colorBuffer);
				}
				else if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeMaskedColorWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, colorMaskFactor, colorMaskNegationFactor, sRGBTarget, colorBuffer);
				break;
			}
			case rr::GENERICVECTYPE_INT32:
				// Write fragments
				for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				{
					if (m_sampleRegister[regSampleNdx].isAlive)
					{
						const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

						m_sampleRegister[regSampleNdx].signedValue = frag.value.get<deInt32>();
					}
				}

				if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeSignedValueWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.colorMask, colorBuffer);
				break;

			case rr::GENERICVECTYPE_UINT32:
				// Write fragments
				for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
				{
					if (m_sampleRegister[regSampleNdx].isAlive)
					{
						const Fragment& frag = inputFragments[groupFirstFragNdx + regSampleNdx/numSamplesPerFragment];

						m_sampleRegister[regSampleNdx].unsignedValue = frag.value.get<deUint32>();
					}
				}

				if (state.colorMask[0] || state.colorMask[1] || state.colorMask[2] || state.colorMask[3])
					executeUnsignedValueWrite(groupFirstFragNdx, numSamplesPerFragment, inputFragments, state.colorMask, colorBuffer);
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}